

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O1

void __thiscall Bmp::Bmp(Bmp *this,string *file)

{
  dword dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  FILE *__stream;
  BmpColor **ppBVar4;
  BmpColor *pBVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  __stream = fopen((file->_M_dataplus)._M_p,"rb");
  fread(&this->m_bf,1,0xe,__stream);
  fread(&this->m_bi,1,0x28,__stream);
  dVar1 = (this->m_bi).biWidth;
  lVar9 = (long)(int)dVar1;
  uVar8 = lVar9 * 8;
  this->m_w = dVar1;
  dVar1 = (this->m_bi).biHeight;
  this->m_h = dVar1;
  if (lVar9 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  ppBVar4 = (BmpColor **)operator_new__(uVar8);
  this->m_data = ppBVar4;
  if (0 < lVar9) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(int)dVar1;
    uVar8 = SUB168(auVar3 * ZEXT816(3),0);
    if (SUB168(auVar3 * ZEXT816(3),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    lVar7 = 0;
    do {
      pBVar5 = (BmpColor *)operator_new__(uVar8);
      this->m_data[lVar7] = pBVar5;
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  uVar8 = (long)(int)dVar1;
  if (0 < (int)dVar1) {
    do {
      uVar10 = uVar8 - 1;
      if (0 < this->m_w) {
        lVar9 = 0;
        do {
          fread(&this->m_data[lVar9][uVar10].b,1,1,__stream);
          fread(&this->m_data[lVar9][uVar10].g,1,1,__stream);
          fread(this->m_data[lVar9] + uVar10,1,1,__stream);
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->m_w);
      }
      if (0 < (int)(this->m_w & 0x80000003U)) {
        iVar6 = 0;
        do {
          fgetc(__stream);
          iVar6 = iVar6 + 1;
        } while (iVar6 < this->m_w % 4);
      }
      bVar2 = 1 < (long)uVar8;
      uVar8 = uVar10;
    } while (bVar2);
  }
  fclose(__stream);
  return;
}

Assistant:

Bmp::Bmp(const std::string& file)
{
    FILE* f = fopen(file.c_str(), "rb");

    fread(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fread(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);

    m_w = m_bi.biWidth, m_h = m_bi.biHeight;
    m_data = new BmpColor*[m_w];
    for (int i = 0; i < m_w; i++) m_data[i] = new BmpColor[m_h];

    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fread(&m_data[i][j].b, 1, sizeof(byte), f);
            fread(&m_data[i][j].g, 1, sizeof(byte), f);
            fread(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fgetc(f);
    }

    fclose(f);
}